

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

void __thiscall
SQCompilation::CheckerVisitor::applyKnownInvocationToScope(CheckerVisitor *this,ValueRef *value)

{
  bool bVar1;
  TreeOp TVar2;
  DeclExpr *this_00;
  TableDecl *this_01;
  mapped_type *ppFVar3;
  ArenaVector<SQCompilation::TableMember> *this_02;
  const_iterator pTVar4;
  Node *this_03;
  const_iterator this_04;
  const_iterator name;
  reference pMVar5;
  pointer ppVar6;
  ValueRef *in_RSI;
  long in_RDI;
  iterator it;
  VarScope *scope;
  Modifiable s;
  const_iterator __end1;
  const_iterator __begin1;
  vector<SQCompilation::FunctionInfo::Modifiable,_std::allocator<SQCompilation::FunctionInfo::Modifiable>_>
  *__range1;
  Decl *de;
  Expr *me;
  TableMember *m;
  const_iterator __end5;
  const_iterator __begin5;
  ArenaVector<SQCompilation::TableMember> *__range5;
  ClassDecl *klass;
  Decl *decl;
  Expr *expr;
  FunctionInfo *info;
  unordered_map<const_char_*,_SQCompilation::ValueRef_*,_SQCompilation::StringHasher,_SQCompilation::StringEqualer,_std::allocator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>_>_>
  *in_stack_ffffffffffffff38;
  CheckerVisitor *in_stack_ffffffffffffff40;
  _Node_iterator_base<std::pair<const_char_*const,_SQCompilation::ValueRef_*>,_true> local_b0;
  _Node_iterator_base<std::pair<const_char_*const,_SQCompilation::ValueRef_*>,_true> local_a8;
  VarScope *local_a0;
  FunctionDecl *local_98;
  CheckerVisitor *in_stack_ffffffffffffff70;
  FunctionDecl *o;
  const_iterator local_48;
  mapped_type local_18;
  
  local_18 = (mapped_type)0x0;
  bVar1 = ValueRef::hasValue(in_RSI);
  if (bVar1) {
    this_00 = (DeclExpr *)
              maybeEval(in_stack_ffffffffffffff40,(Expr *)in_stack_ffffffffffffff38,false);
    TVar2 = Node::op((Node *)this_00);
    if (TVar2 == TO_DECL_EXPR) {
      this_01 = (TableDecl *)DeclExpr::declaration(this_00);
      TVar2 = Node::op((Node *)this_01);
      if ((TVar2 == TO_FUNCTION) || (TVar2 = Node::op((Node *)this_01), TVar2 == TO_CONSTRUCTOR)) {
        ppFVar3 = std::
                  unordered_map<const_SQCompilation::FunctionDecl_*,_SQCompilation::FunctionInfo_*,_std::hash<const_SQCompilation::FunctionDecl_*>,_std::equal_to<const_SQCompilation::FunctionDecl_*>,_std::allocator<std::pair<const_SQCompilation::FunctionDecl_*const,_SQCompilation::FunctionInfo_*>_>_>
                  ::operator[]((unordered_map<const_SQCompilation::FunctionDecl_*,_SQCompilation::FunctionInfo_*,_std::hash<const_SQCompilation::FunctionDecl_*>,_std::equal_to<const_SQCompilation::FunctionDecl_*>,_std::allocator<std::pair<const_SQCompilation::FunctionDecl_*const,_SQCompilation::FunctionInfo_*>_>_>
                                *)in_stack_ffffffffffffff40,(key_type *)in_stack_ffffffffffffff38);
        local_18 = *ppFVar3;
      }
      else {
        TVar2 = Node::op((Node *)this_01);
        if (TVar2 != TO_CLASS) {
          applyUnknownInvocationToScope(in_stack_ffffffffffffff70);
          return;
        }
        this_02 = TableDecl::members(this_01);
        local_48 = ArenaVector<SQCompilation::TableMember>::begin(this_02);
        pTVar4 = ArenaVector<SQCompilation::TableMember>::end(this_02);
        for (; local_48 != pTVar4; local_48 = local_48 + 1) {
          TVar2 = Node::op(&local_48->value->super_Node);
          if (TVar2 == TO_DECL_EXPR) {
            this_03 = (Node *)DeclExpr::declaration((DeclExpr *)local_48->value);
            TVar2 = Node::op(this_03);
            if (TVar2 == TO_CONSTRUCTOR) {
              ppFVar3 = std::
                        unordered_map<const_SQCompilation::FunctionDecl_*,_SQCompilation::FunctionInfo_*,_std::hash<const_SQCompilation::FunctionDecl_*>,_std::equal_to<const_SQCompilation::FunctionDecl_*>,_std::allocator<std::pair<const_SQCompilation::FunctionDecl_*const,_SQCompilation::FunctionInfo_*>_>_>
                        ::operator[]((unordered_map<const_SQCompilation::FunctionDecl_*,_SQCompilation::FunctionInfo_*,_std::hash<const_SQCompilation::FunctionDecl_*>,_std::equal_to<const_SQCompilation::FunctionDecl_*>,_std::allocator<std::pair<const_SQCompilation::FunctionDecl_*const,_SQCompilation::FunctionInfo_*>_>_>
                                      *)in_stack_ffffffffffffff40,
                                     (key_type *)in_stack_ffffffffffffff38);
              local_18 = *ppFVar3;
              break;
            }
          }
        }
      }
    }
    else {
      TVar2 = Node::op((Node *)this_00);
      if (TVar2 == TO_EXTERNAL_VALUE) {
        applyUnknownInvocationToScope(in_stack_ffffffffffffff70);
        return;
      }
    }
  }
  if (local_18 != (mapped_type)0x0) {
    this_04 = std::
              vector<SQCompilation::FunctionInfo::Modifiable,_std::allocator<SQCompilation::FunctionInfo::Modifiable>_>
              ::begin((vector<SQCompilation::FunctionInfo::Modifiable,_std::allocator<SQCompilation::FunctionInfo::Modifiable>_>
                       *)in_stack_ffffffffffffff38);
    name = std::
           vector<SQCompilation::FunctionInfo::Modifiable,_std::allocator<SQCompilation::FunctionInfo::Modifiable>_>
           ::end((vector<SQCompilation::FunctionInfo::Modifiable,_std::allocator<SQCompilation::FunctionInfo::Modifiable>_>
                  *)in_stack_ffffffffffffff38);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_SQCompilation::FunctionInfo::Modifiable_*,_std::vector<SQCompilation::FunctionInfo::Modifiable,_std::allocator<SQCompilation::FunctionInfo::Modifiable>_>_>
                               *)in_stack_ffffffffffffff40,
                              (__normal_iterator<const_SQCompilation::FunctionInfo::Modifiable_*,_std::vector<SQCompilation::FunctionInfo::Modifiable,_std::allocator<SQCompilation::FunctionInfo::Modifiable>_>_>
                               *)in_stack_ffffffffffffff38), bVar1) {
      pMVar5 = __gnu_cxx::
               __normal_iterator<const_SQCompilation::FunctionInfo::Modifiable_*,_std::vector<SQCompilation::FunctionInfo::Modifiable,_std::allocator<SQCompilation::FunctionInfo::Modifiable>_>_>
               ::operator*((__normal_iterator<const_SQCompilation::FunctionInfo::Modifiable_*,_std::vector<SQCompilation::FunctionInfo::Modifiable,_std::allocator<SQCompilation::FunctionInfo::Modifiable>_>_>
                            *)&stack0xffffffffffffff80);
      local_98 = pMVar5->owner;
      o = (FunctionDecl *)pMVar5->name;
      local_a0 = VarScope::findScope(*(VarScope **)(in_RDI + 0x40),local_98);
      if (local_a0 != (VarScope *)0x0) {
        local_a8._M_cur =
             (__node_type *)
             std::
             unordered_map<const_char_*,_SQCompilation::ValueRef_*,_SQCompilation::StringHasher,_SQCompilation::StringEqualer,_std::allocator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>_>_>
             ::find(in_stack_ffffffffffffff38,(key_type *)0x19693e);
        local_b0._M_cur =
             (__node_type *)
             std::
             unordered_map<const_char_*,_SQCompilation::ValueRef_*,_SQCompilation::StringHasher,_SQCompilation::StringEqualer,_std::allocator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>_>_>
             ::end(in_stack_ffffffffffffff38);
        bVar1 = std::__detail::operator!=(&local_a8,&local_b0);
        if (bVar1) {
          std::__detail::
          _Node_iterator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>,_false,_true>::
          operator->((_Node_iterator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>,_false,_true>
                      *)0x196978);
          bVar1 = ValueRef::isConstant((ValueRef *)0x196981);
          if (!bVar1) {
            if (*(long *)(in_RDI + 0x150) != 0) {
              in_stack_ffffffffffffff38 =
                   *(unordered_map<const_char_*,_SQCompilation::ValueRef_*,_SQCompilation::StringHasher,_SQCompilation::StringEqualer,_std::allocator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>_>_>
                     **)(in_RDI + 0x150);
              ppVar6 = std::__detail::
                       _Node_iterator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>,_false,_true>
                       ::operator->((_Node_iterator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>,_false,_true>
                                     *)0x1969b2);
              in_stack_ffffffffffffff40 = (CheckerVisitor *)ppVar6->first;
              std::__detail::
              _Node_iterator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>,_false,_true>::
              operator->((_Node_iterator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>,_false,_true>
                          *)0x1969c4);
              FunctionInfo::addModifiable
                        ((FunctionInfo *)this_04._M_current,(SQChar *)name._M_current,o);
            }
            ppVar6 = std::__detail::
                     _Node_iterator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>,_false,_true>
                     ::operator->((_Node_iterator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>,_false,_true>
                                   *)0x1969eb);
            ValueRef::kill(ppVar6->second,4,1);
          }
        }
      }
      __gnu_cxx::
      __normal_iterator<const_SQCompilation::FunctionInfo::Modifiable_*,_std::vector<SQCompilation::FunctionInfo::Modifiable,_std::allocator<SQCompilation::FunctionInfo::Modifiable>_>_>
      ::operator++((__normal_iterator<const_SQCompilation::FunctionInfo::Modifiable_*,_std::vector<SQCompilation::FunctionInfo::Modifiable,_std::allocator<SQCompilation::FunctionInfo::Modifiable>_>_>
                    *)&stack0xffffffffffffff80);
    }
  }
  return;
}

Assistant:

void CheckerVisitor::applyKnownInvocationToScope(const ValueRef *value) {
  const FunctionInfo *info = nullptr;

  if (value->hasValue()) {
    const Expr *expr = maybeEval(value->expression);
    assert(expr != nullptr);

    if (expr->op() == TO_DECL_EXPR) { //-V522
      const Decl *decl = static_cast<const DeclExpr *>(expr)->declaration();
      if (decl->op() == TO_FUNCTION || decl->op() == TO_CONSTRUCTOR) {
        info = functionInfoMap[static_cast<const FunctionDecl *>(decl)];
      }
      else if (decl->op() == TO_CLASS) {
        const ClassDecl *klass = static_cast<const ClassDecl *>(decl);
        for (auto &m : klass->members()) {
          const Expr *me = m.value;
          if (me->op() == TO_DECL_EXPR) {
            const Decl *de = static_cast<const DeclExpr *>(m.value)->declaration();
            if (de->op() == TO_CONSTRUCTOR) {
              info = functionInfoMap[static_cast<const FunctionDecl *>(de)];
              break;
            }
          }
        }
      }
      else {
        applyUnknownInvocationToScope();
        return;
      }
    }
    else if (expr->op() == TO_EXTERNAL_VALUE) {
      applyUnknownInvocationToScope();
      return;
    }
  }

  if (!info) {
    // probably it is class constructor
    return;
  }

  for (auto s : info->modifiable) {
    VarScope *scope = currentScope->findScope(s.owner);
    if (!scope)
      continue;

    auto it = scope->symbols.find(s.name);
    if (it != scope->symbols.end()) {
      if (it->second->isConstant())
        continue;

      if (currentInfo) {
        currentInfo->addModifiable(it->first, it->second->info->ownedScope->owner);
      }
      it->second->kill();
    }
  }
}